

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group.cxx
# Opt level: O0

int __thiscall Fl_Group::handle(Fl_Group *this,int event)

{
  bool bVar1;
  Fl_Widget_Tracker FVar2;
  int iVar3;
  uint uVar4;
  Fl_Widget *pFVar5;
  Fl_Widget *pFVar6;
  ssize_t sVar7;
  int iVar8;
  long lVar9;
  Fl_Widget **ppFVar10;
  size_t __n;
  size_t __n_00;
  size_t __n_01;
  size_t __n_02;
  size_t __n_03;
  size_t __n_04;
  size_t __n_05;
  size_t __n_06;
  size_t __n_07;
  size_t __n_08;
  size_t __n_09;
  int local_58;
  int j;
  int old_event;
  Fl_Widget_Tracker local_40;
  Fl_Widget_Tracker wp;
  Fl_Widget *o;
  Fl_Widget **ppFStack_28;
  int i;
  Fl_Widget **a;
  int event_local;
  Fl_Group *this_local;
  
  ppFStack_28 = array(this);
  switch(event) {
  case 1:
    o._4_4_ = children(this);
    do {
      do {
        iVar3 = o._4_4_ + -1;
        if (o._4_4_ == 0) {
          return 0;
        }
        lVar9 = (long)iVar3;
        wp.wp_ = ppFStack_28[lVar9];
        uVar4 = Fl_Widget::takesevents(wp.wp_);
        iVar8 = (int)lVar9;
        o._4_4_ = iVar3;
      } while ((uVar4 == 0) || (iVar3 = Fl::event_inside(wp.wp_), iVar3 == 0));
      Fl_Widget_Tracker::Fl_Widget_Tracker(&local_40,wp.wp_);
      sVar7 = send((int)wp.wp_,&DAT_00000001,__n_04,iVar8);
      if ((int)sVar7 == 0) {
        bVar1 = false;
      }
      else {
        pFVar5 = Fl::pushed();
        if ((pFVar5 != (Fl_Widget *)0x0) &&
           (iVar3 = Fl_Widget_Tracker::exists(&local_40), FVar2 = wp, iVar3 != 0)) {
          pFVar5 = Fl::pushed();
          iVar3 = Fl_Widget::contains(FVar2.wp_,pFVar5);
          if (iVar3 == 0) {
            Fl::pushed(wp.wp_);
          }
        }
        this_local._4_4_ = 1;
        bVar1 = true;
      }
      Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_40);
    } while (!bVar1);
    break;
  case 2:
  case 5:
    wp.wp_ = Fl::pushed();
    if ((Fl_Group *)wp.wp_ == this) {
      this_local._4_4_ = 0;
    }
    else if ((Fl_Group *)wp.wp_ == (Fl_Group *)0x0) {
      o._4_4_ = children(this);
      do {
        iVar3 = o._4_4_ + -1;
        if (o._4_4_ == 0) goto LAB_001e323a;
        lVar9 = (long)iVar3;
        wp.wp_ = ppFStack_28[lVar9];
        uVar4 = Fl_Widget::takesevents(wp.wp_);
        iVar8 = (int)lVar9;
        o._4_4_ = iVar3;
      } while (((uVar4 == 0) || (iVar3 = Fl::event_inside(wp.wp_), iVar3 == 0)) ||
              (sVar7 = send((int)wp.wp_,(void *)(ulong)(uint)event,__n_06,iVar8), (int)sVar7 == 0));
      this_local._4_4_ = 1;
    }
    else {
      send((int)wp.wp_,(void *)(ulong)(uint)event,__n_05,(int)wp.wp_);
LAB_001e323a:
      this_local._4_4_ = 0;
    }
    break;
  case 3:
  case 0xb:
    o._4_4_ = children(this);
    do {
      do {
        iVar3 = o._4_4_ + -1;
        if (o._4_4_ == 0) {
          Fl::belowmouse(&this->super_Fl_Widget);
          return 1;
        }
        lVar9 = (long)iVar3;
        wp.wp_ = ppFStack_28[lVar9];
        uVar4 = Fl_Widget::visible(wp.wp_);
        iVar8 = (int)lVar9;
        o._4_4_ = iVar3;
      } while ((uVar4 == 0) || (iVar3 = Fl::event_inside(wp.wp_), FVar2 = wp, iVar3 == 0));
      pFVar5 = Fl::belowmouse();
      iVar3 = Fl_Widget::contains(FVar2.wp_,pFVar5);
      if (iVar3 != 0) {
        sVar7 = send((int)wp.wp_,&DAT_0000000b,__n_01,iVar8);
        return (int)sVar7;
      }
      Fl::belowmouse(wp.wp_);
      sVar7 = send((int)wp.wp_,&DAT_00000003,__n_02,iVar8);
    } while ((int)sVar7 == 0);
    this_local._4_4_ = 1;
    break;
  default:
    for (o._4_4_ = 0;
        (iVar3 = children(this), o._4_4_ < iVar3 && (Fl::focus_ != ppFStack_28[o._4_4_]));
        o._4_4_ = o._4_4_ + 1) {
    }
    iVar3 = children(this);
    if (iVar3 <= o._4_4_) {
      o._4_4_ = 0;
    }
    iVar3 = children(this);
    if (iVar3 != 0) {
      local_58 = o._4_4_;
      do {
        uVar4 = Fl_Widget::takesevents(ppFStack_28[local_58]);
        if ((uVar4 != 0) &&
           (sVar7 = send((int)ppFStack_28[local_58],(void *)(ulong)(uint)event,__n_09,local_58),
           (int)sVar7 != 0)) {
          return 1;
        }
        local_58 = local_58 + 1;
        iVar3 = children(this);
        if (iVar3 <= local_58) {
          local_58 = 0;
        }
      } while (local_58 != o._4_4_);
    }
    this_local._4_4_ = 0;
    break;
  case 6:
    iVar3 = navkey();
    if (iVar3 - 0xff51U < 2) {
      o._4_4_ = children(this);
      do {
        if (o._4_4_ == 0) {
          return 0;
        }
        iVar3 = Fl_Widget::take_focus(ppFStack_28[o._4_4_ + -1]);
        o._4_4_ = o._4_4_ + -1;
      } while (iVar3 == 0);
      this_local._4_4_ = 1;
    }
    else if (((iVar3 - 0xff53U < 2) || (this->savedfocus_ == (Fl_Widget *)0x0)) ||
            (iVar3 = Fl_Widget::take_focus(this->savedfocus_), iVar3 == 0)) {
      o._4_4_ = children(this);
      do {
        if (o._4_4_ == 0) {
          return 0;
        }
        iVar3 = Fl_Widget::take_focus(*ppFStack_28);
        o._4_4_ = o._4_4_ + -1;
        ppFStack_28 = ppFStack_28 + 1;
      } while (iVar3 == 0);
      this_local._4_4_ = 1;
    }
    else {
      this_local._4_4_ = 1;
    }
    break;
  case 7:
    this->savedfocus_ = fl_oldfocus;
    this_local._4_4_ = 0;
    break;
  case 8:
    iVar3 = navkey();
    this_local._4_4_ = navigation(this,iVar3);
    break;
  case 0xc:
    o._4_4_ = children(this);
    do {
      iVar3 = o._4_4_ + -1;
      if (o._4_4_ == 0) {
        o._4_4_ = children(this);
        do {
          iVar3 = o._4_4_ + -1;
          if (o._4_4_ == 0) {
            iVar3 = Fl::event_key();
            if ((iVar3 != 0xff0d) && (iVar3 = Fl::event_key(), iVar3 != 0xff8d)) {
              return 0;
            }
            iVar3 = navigation(this,0xff54);
            return iVar3;
          }
          lVar9 = (long)iVar3;
          wp.wp_ = ppFStack_28[lVar9];
          uVar4 = Fl_Widget::takesevents(wp.wp_);
          iVar8 = (int)lVar9;
          o._4_4_ = iVar3;
        } while (((uVar4 == 0) || (iVar3 = Fl::event_inside(wp.wp_), iVar3 != 0)) ||
                (sVar7 = send((int)wp.wp_,&DAT_0000000c,__n_00,iVar8), (int)sVar7 == 0));
        return 1;
      }
      lVar9 = (long)iVar3;
      wp.wp_ = ppFStack_28[lVar9];
      uVar4 = Fl_Widget::takesevents(wp.wp_);
      iVar8 = (int)lVar9;
      o._4_4_ = iVar3;
    } while (((uVar4 == 0) || (iVar3 = Fl::event_inside(wp.wp_), iVar3 == 0)) ||
            (sVar7 = send((int)wp.wp_,&DAT_0000000c,__n,iVar8), (int)sVar7 == 0));
    this_local._4_4_ = 1;
    break;
  case 0xd:
  case 0xe:
    o._4_4_ = children(this);
    while (iVar3 = o._4_4_ + -1, o._4_4_ != 0) {
      ppFVar10 = ppFStack_28 + 1;
      wp.wp_ = *ppFStack_28;
      uVar4 = Fl_Widget::active(wp.wp_);
      o._4_4_ = iVar3;
      ppFStack_28 = ppFVar10;
      if (uVar4 != 0) {
        (*(wp.wp_)->_vptr_Fl_Widget[3])(wp.wp_,(ulong)(uint)event);
      }
    }
    this_local._4_4_ = 1;
    break;
  case 0xf:
  case 0x10:
    o._4_4_ = children(this);
    while (iVar3 = o._4_4_ + -1, o._4_4_ != 0) {
      ppFVar10 = ppFStack_28 + 1;
      pFVar5 = *ppFStack_28;
      wp.wp_ = pFVar5;
      if ((event == 0xf) && (pFVar6 = Fl::focus(), iVar8 = Fl::e_number, pFVar5 == pFVar6)) {
        Fl::e_number = 7;
        (*(wp.wp_)->_vptr_Fl_Widget[3])(wp.wp_,7);
        Fl::e_number = iVar8;
        Fl::focus((Fl_Widget *)0x0);
      }
      uVar4 = Fl_Widget::visible(wp.wp_);
      o._4_4_ = iVar3;
      ppFStack_28 = ppFVar10;
      if (uVar4 != 0) {
        (*(wp.wp_)->_vptr_Fl_Widget[3])(wp.wp_,(ulong)(uint)event);
      }
    }
    this_local._4_4_ = 1;
    break;
  case 0x13:
    o._4_4_ = children(this);
    do {
      iVar3 = o._4_4_ + -1;
      if (o._4_4_ == 0) {
        o._4_4_ = children(this);
        do {
          iVar3 = o._4_4_ + -1;
          if (o._4_4_ == 0) {
            return 0;
          }
          lVar9 = (long)iVar3;
          wp.wp_ = ppFStack_28[lVar9];
          uVar4 = Fl_Widget::takesevents(wp.wp_);
          iVar8 = (int)lVar9;
          o._4_4_ = iVar3;
        } while (((uVar4 == 0) || (iVar3 = Fl::event_inside(wp.wp_), iVar3 != 0)) ||
                (sVar7 = send((int)wp.wp_,(void *)0x13,__n_08,iVar8), (int)sVar7 == 0));
        return 1;
      }
      lVar9 = (long)iVar3;
      wp.wp_ = ppFStack_28[lVar9];
      uVar4 = Fl_Widget::takesevents(wp.wp_);
      iVar8 = (int)lVar9;
      o._4_4_ = iVar3;
    } while (((uVar4 == 0) || (iVar3 = Fl::event_inside(wp.wp_), iVar3 == 0)) ||
            (sVar7 = send((int)wp.wp_,(void *)0x13,__n_07,iVar8), (int)sVar7 == 0));
    this_local._4_4_ = 1;
    break;
  case 0x14:
  case 0x15:
    o._4_4_ = children(this);
    do {
      do {
        iVar3 = o._4_4_ + -1;
        if (o._4_4_ == 0) {
          Fl::belowmouse(&this->super_Fl_Widget);
          return 0;
        }
        lVar9 = (long)iVar3;
        wp.wp_ = ppFStack_28[lVar9];
        uVar4 = Fl_Widget::takesevents(wp.wp_);
        iVar8 = (int)lVar9;
        o._4_4_ = iVar3;
      } while ((uVar4 == 0) || (iVar3 = Fl::event_inside(wp.wp_), FVar2 = wp, iVar3 == 0));
      pFVar5 = Fl::belowmouse();
      iVar3 = Fl_Widget::contains(FVar2.wp_,pFVar5);
      if (iVar3 != 0) {
        sVar7 = send((int)wp.wp_,&DAT_00000015,__n_03,iVar8);
        return (int)sVar7;
      }
      sVar7 = send((int)wp.wp_,&DAT_00000014,__n_03,iVar8);
      FVar2 = wp;
    } while ((int)sVar7 == 0);
    pFVar5 = Fl::belowmouse();
    iVar3 = Fl_Widget::contains(FVar2.wp_,pFVar5);
    if (iVar3 == 0) {
      Fl::belowmouse(wp.wp_);
    }
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Group::handle(int event) {

  Fl_Widget*const* a = array();
  int i;
  Fl_Widget* o;

  switch (event) {

  case FL_FOCUS:
    switch (navkey()) {
    default:
      if (savedfocus_ && savedfocus_->take_focus()) return 1;
    case FL_Right:
    case FL_Down:
      for (i = children(); i--;) if ((*a++)->take_focus()) return 1;
      break;
    case FL_Left:
    case FL_Up:
      for (i = children(); i--;) if (a[i]->take_focus()) return 1;
      break;
    }
    return 0;

  case FL_UNFOCUS:
    savedfocus_ = fl_oldfocus;
    return 0;

  case FL_KEYBOARD:
    return navigation(navkey());

  case FL_SHORTCUT:
    for (i = children(); i--;) {
      o = a[i];
      if (o->takesevents() && Fl::event_inside(o) && send(o,FL_SHORTCUT))
	return 1;
    }
    for (i = children(); i--;) {
      o = a[i];
      if (o->takesevents() && !Fl::event_inside(o) && send(o,FL_SHORTCUT))
	return 1;
    }
    if ((Fl::event_key() == FL_Enter || Fl::event_key() == FL_KP_Enter)) return navigation(FL_Down);
    return 0;

  case FL_ENTER:
  case FL_MOVE:
    for (i = children(); i--;) {
      o = a[i];
      if (o->visible() && Fl::event_inside(o)) {
	if (o->contains(Fl::belowmouse())) {
	  return send(o,FL_MOVE);
	} else {
	  Fl::belowmouse(o);
	  if (send(o,FL_ENTER)) return 1;
	}
      }
    }
    Fl::belowmouse(this);
    return 1;

  case FL_DND_ENTER:
  case FL_DND_DRAG:
    for (i = children(); i--;) {
      o = a[i];
      if (o->takesevents() && Fl::event_inside(o)) {
	if (o->contains(Fl::belowmouse())) {
	  return send(o,FL_DND_DRAG);
	} else if (send(o,FL_DND_ENTER)) {
	  if (!o->contains(Fl::belowmouse())) Fl::belowmouse(o);
	  return 1;
	}
      }
    }
    Fl::belowmouse(this);
    return 0;

  case FL_PUSH:
    for (i = children(); i--;) {
      o = a[i];
      if (o->takesevents() && Fl::event_inside(o)) {
	Fl_Widget_Tracker wp(o);
	if (send(o,FL_PUSH)) {
	  if (Fl::pushed() && wp.exists() && !o->contains(Fl::pushed())) Fl::pushed(o);
	  return 1;
	}
      }
    }
    return 0;

  case FL_RELEASE:
  case FL_DRAG:
    o = Fl::pushed();
    if (o == this) return 0;
    else if (o) send(o,event);
    else {
      for (i = children(); i--;) {
	o = a[i];
	if (o->takesevents() && Fl::event_inside(o)) {
	  if (send(o,event)) return 1;
	}
      }
    }
    return 0;

  case FL_MOUSEWHEEL:
    for (i = children(); i--;) {
      o = a[i];
      if (o->takesevents() && Fl::event_inside(o) && send(o,FL_MOUSEWHEEL))
	return 1;
    }
    for (i = children(); i--;) {
      o = a[i];
      if (o->takesevents() && !Fl::event_inside(o) && send(o,FL_MOUSEWHEEL))
	return 1;
    }
    return 0;

  case FL_DEACTIVATE:
  case FL_ACTIVATE:
    for (i = children(); i--;) {
      o = *a++;
      if (o->active()) o->handle(event);
    }
    return 1;

  case FL_SHOW:
  case FL_HIDE:
    for (i = children(); i--;) {
      o = *a++;
      if (event == FL_HIDE && o == Fl::focus()) {
        // Give up input focus...
	int old_event = Fl::e_number;
        o->handle(Fl::e_number = FL_UNFOCUS);
	Fl::e_number = old_event;
	Fl::focus(0);
      }
      if (o->visible()) o->handle(event);
    }
    return 1;

  default:
    // For all other events, try to give to each child, starting at focus:
    for (i = 0; i < children(); i ++)
      if (Fl::focus_ == a[i]) break;

    if (i >= children()) i = 0;

    if (children()) {
      for (int j = i;;) {
        if (a[j]->takesevents()) if (send(a[j], event)) return 1;
        j++;
        if (j >= children()) j = 0;
        if (j == i) break;
      }
    }

    return 0;
  }
}